

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int setElementTypePrefix(XML_Parser parser,ELEMENT_TYPE *elementType)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined1 *puVar4;
  PREFIX *pPVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar7 = elementType->name;
  do {
    if (*pcVar7 == ':') {
      for (pcVar6 = elementType->name; pcVar6 != pcVar7; pcVar6 = pcVar6 + 1) {
        pcVar3 = *(char **)((long)parser + 0x348);
        if (pcVar3 == *(char **)((long)parser + 0x340)) {
          iVar2 = poolGrow((STRING_POOL *)((long)parser + 0x330));
          if (iVar2 == 0) {
            return 0;
          }
          pcVar3 = *(char **)((long)parser + 0x348);
        }
        cVar1 = *pcVar6;
        *(char **)((long)parser + 0x348) = pcVar3 + 1;
        *pcVar3 = cVar1;
      }
      puVar4 = *(undefined1 **)((long)parser + 0x348);
      if (puVar4 == *(undefined1 **)((long)parser + 0x340)) {
        iVar2 = poolGrow((STRING_POOL *)((long)parser + 0x330));
        if (iVar2 == 0) {
          return 0;
        }
        puVar4 = *(undefined1 **)((long)parser + 0x348);
      }
      *(undefined1 **)((long)parser + 0x348) = puVar4 + 1;
      *puVar4 = 0;
      pPVar5 = (PREFIX *)
               lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x350),0x10);
      if (pPVar5 == (PREFIX *)0x0) {
        return 0;
      }
      if (pPVar5->name == *(KEY *)((long)parser + 0x350)) {
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
      }
      else {
        *(KEY *)((long)parser + 0x348) = *(KEY *)((long)parser + 0x350);
      }
      elementType->prefix = pPVar5;
    }
    else if (*pcVar7 == '\0') {
      return 1;
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

static int setElementTypePrefix(XML_Parser parser, ELEMENT_TYPE *elementType)
{
  const XML_Char *name;
  for (name = elementType->name; *name; name++) {
    if (*name == XML_T(':')) {
      PREFIX *prefix;
      const XML_Char *s;
      for (s = elementType->name; s != name; s++) {
        if (!poolAppendChar(&dtd.pool, *s))
          return 0;
      }
      if (!poolAppendChar(&dtd.pool, XML_T('\0')))
        return 0;
      prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
      if (!prefix)
        return 0;
      if (prefix->name == poolStart(&dtd.pool))
        poolFinish(&dtd.pool);
      else
        poolDiscard(&dtd.pool);
      elementType->prefix = prefix;

    }
  }
  return 1;
}